

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_reporter.h
# Opt level: O2

void __thiscall bandit::detail::info_reporter::context_ended(info_reporter *this,char *desc)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  string local_40;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&(this->super_progress_reporter).contexts_);
  this->indentation_ = this->indentation_ + -1;
  poVar1 = this->stm_;
  indent_abi_cxx11_(&local_40,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  pcVar2 = "\x1b[1;34m";
  pcVar3 = "";
  if (this->colorizer_->colors_enabled_ == false) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"end ");
  if (this->colorizer_->colors_enabled_ != false) {
    pcVar3 = "\x1b[0m";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,desc);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

virtual void context_ended(const char *desc)
	{
		progress_reporter::context_ended(desc);
		--indentation_;
		stm_
		  << indent()
		  << colorizer_.blue()
		  << "end "
		  << colorizer_.reset()
		  << desc << std::endl;
	}